

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

int __thiscall
CVmObjLookupTable::getp_apply_all
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_val_t *this_00;
  vm_lookup_ext *this_01;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  vm_val_t *in_RDI;
  vm_rcdesc rc;
  uint i;
  vm_lookup_val *entry;
  vm_val_t *fn;
  vm_val_t *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  vm_obj_id_t in_stack_ffffffffffffff54;
  vm_rcdesc *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  vm_obj_id_t argc_00;
  CVmRun *in_stack_ffffffffffffff70;
  vm_val_t *in_stack_ffffffffffffff78;
  unsigned_short in_stack_ffffffffffffff82;
  vm_obj_id_t in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  vm_rcdesc *in_stack_ffffffffffffff90;
  uint local_48;
  vm_rcdesc *local_38;
  
  if ((getp_apply_all(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_apply_all(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_apply_all::desc,1);
    __cxa_guard_release(&getp_apply_all(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  argc_00 = in_ESI;
  CVmStack::get(0);
  vm_rcdesc::vm_rcdesc
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
             in_stack_ffffffffffffff82,in_stack_ffffffffffffff78,(uint *)in_stack_ffffffffffffff70);
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)in_stack_ffffffffffffff58,
                     (uint *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff48);
  if (iVar1 == 0) {
    CVmStack::get(0);
    this_00 = CVmStack::push();
    vm_val_t::set_obj(this_00,in_ESI);
    local_48 = get_entry_count((CVmObjLookupTable *)0x3685d4);
    this_01 = get_ext((CVmObjLookupTable *)in_RDI);
    local_38 = (vm_rcdesc *)vm_lookup_ext::idx_to_val(this_01,0);
    for (; local_48 != 0; local_48 = local_48 - 1) {
      if (((vm_val_t *)&local_38->argp)->typ != VM_EMPTY) {
        CVmStack::push((vm_val_t *)&local_38->name);
        CVmStack::push((vm_val_t *)local_38);
        CVmRun::call_func_ptr
                  (in_stack_ffffffffffffff70,in_RDI,argc_00,in_stack_ffffffffffffff58,
                   in_stack_ffffffffffffff54);
        in_stack_ffffffffffffff54 = in_ESI;
        in_stack_ffffffffffffff58 = local_38;
        CVmRun::get_r0();
        set_entry_val_undo((CVmObjLookupTable *)CONCAT44(argc_00,in_stack_ffffffffffffff60),
                           (vm_obj_id_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                           (vm_lookup_val *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           in_stack_ffffffffffffff48);
      }
      local_38 = (vm_rcdesc *)&local_38->self;
    }
    CVmStack::discard(2);
    vm_val_t::set_nil(in_RDX);
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_apply_all(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *argc)
{
    vm_val_t *fn;
    vm_lookup_val *entry;
    static CVmNativeCodeDesc desc(1);
    uint i;
    vm_rcdesc rc(vmg_ "LookupTable.applyAll", self, 3, G_stk->get(0), argc);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* the function to invoke is the top argument */
    fn = G_stk->get(0);

    /* push a self-reference for gc protection */
    G_stk->push()->set_obj(self);

    /* iterate over each entry */
    for (i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; ++entry, --i)
    {
        /* 
         *   if the entry is in use (it is if the key is non-empty), invoke
         *   the callback on it 
         */
        if (entry->key.typ != VM_EMPTY)
        {
            /* push the arguments - (key, val) - push in reverse order */
            G_stk->push(&entry->val);
            G_stk->push(&entry->key);
            
            /* invoke the callback */
            G_interpreter->call_func_ptr(vmg_ fn, 2, &rc, 0);
            
            /* replace this element with the result */
            set_entry_val_undo(vmg_ self, entry, G_interpreter->get_r0());
        }
    }

    /* discard the arguments and gc protection */
    G_stk->discard(2);

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}